

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int lj_cf_io_method___tostring(lua_State *L)

{
  IOFileUD *pIVar1;
  lua_State *in_RDI;
  char *unaff_retaddr;
  IOFileUD *iof;
  
  pIVar1 = io_tofilep((lua_State *)0x1387c3);
  if (pIVar1->fp == (FILE *)0x0) {
    lua_pushlstring((lua_State *)iof,unaff_retaddr,(size_t)in_RDI);
  }
  else {
    lua_pushfstring(in_RDI,"file (%p)",pIVar1->fp);
  }
  return 1;
}

Assistant:

LJLIB_CF(io_method___tostring)
{
  IOFileUD *iof = io_tofilep(L);
  if (iof->fp != NULL)
    lua_pushfstring(L, "file (%p)", iof->fp);
  else
    lua_pushliteral(L, "file (closed)");
  return 1;
}